

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O3

bool __thiscall base_uint<256U>::EqualTo(base_uint<256U> *this,uint64_t b)

{
  uint uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  uVar2 = 8;
  do {
    uVar1 = (int)uVar2 - 1;
    uVar2 = (ulong)uVar1;
    if (this->pn[uVar2] != 0) goto LAB_00754427;
  } while (2 < uVar1);
  if ((uint32_t)(b >> 0x20) == this->pn[1]) {
    bVar3 = this->pn[0] == (uint32_t)b;
  }
  else {
LAB_00754427:
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool base_uint<BITS>::EqualTo(uint64_t b) const
{
    for (int i = WIDTH - 1; i >= 2; i--) {
        if (pn[i])
            return false;
    }
    if (pn[1] != (b >> 32))
        return false;
    if (pn[0] != (b & 0xfffffffful))
        return false;
    return true;
}